

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O2

void amrex::RealDescriptor::convertFromNativeFormat
               (void *out,Long nitems,void *in,RealDescriptor *od)

{
  RealDescriptor *ord;
  RealDescriptor *ird;
  IntDescriptor *in_stack_00000008;
  int in_stack_00000010;
  
  ord = FPC::NativeRealDescriptor();
  ird = (RealDescriptor *)FPC::NativeLongDescriptor();
  PD_convert(out,in,nitems,(int)od,ord,ird,in_stack_00000008,in_stack_00000010);
  return;
}

Assistant:

void
RealDescriptor::convertFromNativeFormat (void*                 out,
                                         Long                  nitems,
                                         const void*           in,
                                         const RealDescriptor& od)
{
//    BL_PROFILE("RD:convertFromNativeFormat_vp");
    PD_convert(out,
               in,
               nitems,
               0,
               od,
               FPC::NativeRealDescriptor(),
               FPC::NativeLongDescriptor());
}